

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void OutputCompilerStatistics(CompilerStatistics *statistics,uint outerTotalMicros)

{
  Timer *pTVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  OutputContext outputCtx;
  OutputContext local_270;
  
  local_270.outputBuf = local_270.outputBufDef;
  local_270.outputBufSize = 0x100;
  local_270.outputBufPos = 0;
  local_270.tempBuf = local_270.tempBufDef;
  local_270.tempBufSize = 0x100;
  local_270.stream = (void *)0x0;
  local_270.openStream = OutputContext::FileOpen;
  local_270.writeStream = OutputContext::FileWrite;
  local_270.closeStream = OutputContext::FileClose;
  local_270.stream = fopen("time_stats.txt","w");
  local_270.writeStream = OutputContext::FileWrite;
  uVar4 = (ulong)(statistics->timers).count;
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + *(int *)((long)&((statistics->timers).data)->total + lVar5);
      lVar5 = lVar5 + 0x28;
    } while (uVar4 * 0x28 != lVar5);
  }
  if ((statistics->timers).count != 0) {
    lVar5 = 0x20;
    uVar4 = 0;
    do {
      pTVar1 = (statistics->timers).data;
      uVar2 = (ulong)*(uint *)((long)&(pTVar1->keyName).begin + lVar5);
      OutputContext::Printf
                (&local_270,"%15s %6dms (%3d%%)\n",*(undefined8 *)((long)pTVar1 + lVar5 + -0x10),
                 uVar2 / 1000,(ulong)(uint)(int)(((double)uVar2 * 100.0) / (double)uVar3));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < (statistics->timers).count);
  }
  OutputContext::Printf
            (&local_270,"%15s %6dms (%6dms)\n","total",(ulong)uVar3 / 1000,
             (ulong)outerTotalMicros / 1000);
  if (local_270.outputBufPos != 0) {
    (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
  }
  local_270._264_8_ = local_270._264_8_ & 0xffffffff;
  fclose((FILE *)local_270.stream);
  local_270.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_270);
  return;
}

Assistant:

void OutputCompilerStatistics(CompilerStatistics &statistics, unsigned outerTotalMicros)
{
	OutputContext outputCtx;

	outputCtx.stream = OutputContext::FileOpen("time_stats.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	unsigned total = statistics.Total();

	for(unsigned i = 0; i < statistics.timers.size(); i++)
	{
		CompilerStatistics::Timer &timer = statistics.timers[i];

		outputCtx.Printf("%15s %6dms (%3d%%)\n", timer.outputName.begin, timer.total / 1000, int(timer.total * 100.0 / total));
	}

	outputCtx.Printf("%15s %6dms (%6dms)\n", "total", total / 1000, outerTotalMicros / 1000);

	outputCtx.Flush();

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}